

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinformation.cpp
# Opt level: O0

bool QNetworkInformation::loadBackendByName(QStringView backend)

{
  QStringView s;
  bool bVar1;
  int iVar2;
  QNetworkInformation *pQVar3;
  QNetworkInformation *pQVar4;
  long in_FS_OFFSET;
  QNetworkInformation *loadedBackend;
  size_t RuntimeThreshold;
  size_t i;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  QStringView *lhs;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  byte bVar5;
  bool local_99;
  ulong local_78;
  QStringView in_stack_ffffffffffffffb0;
  QStringView local_28 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lhs = local_28;
  pQVar3 = (QNetworkInformation *)std::data<char16_t_const,6ul>((char16_t (*) [6])L"dummy");
  for (local_78 = 0; (local_78 < 6 && (L"dummy"[local_78] != L'\0')); local_78 = local_78 + 1) {
  }
  QStringView::QStringView<char16_t,_true>
            ((QStringView *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             (char16_t *)pQVar3,(qsizetype)lhs);
  bVar1 = ::operator==(lhs,(QStringView *)
                           CONCAT17(in_stack_ffffffffffffff3f,
                                    CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)));
  if (bVar1) {
    pQVar3 = QNetworkInformationPrivate::createDummy();
    local_99 = pQVar3 != (QNetworkInformation *)0x0;
  }
  else {
    pQVar4 = QNetworkInformationPrivate::create(in_stack_ffffffffffffffb0);
    bVar5 = 0;
    local_99 = false;
    if (pQVar4 != (QNetworkInformation *)0x0) {
      backendName(pQVar3);
      bVar5 = 1;
      s.m_size._7_1_ = 1;
      s.m_size._0_7_ = in_stack_ffffffffffffff50;
      s.m_data = (storage_type_conflict *)pQVar4;
      iVar2 = QString::compare((QString *)
                               CONCAT17(local_99,CONCAT16(in_stack_ffffffffffffff3e,
                                                          in_stack_ffffffffffffff38)),s,
                               CaseInsensitive);
      local_99 = iVar2 == 0;
    }
    if ((bVar5 & 1) != 0) {
      QString::~QString((QString *)0x232b25);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_99;
}

Assistant:

bool QNetworkInformation::loadBackendByName(QStringView backend)
{
    if (backend == u"dummy")
        return QNetworkInformationPrivate::createDummy() != nullptr;

    auto loadedBackend = QNetworkInformationPrivate::create(backend);
    return loadedBackend && loadedBackend->backendName().compare(backend, Qt::CaseInsensitive) == 0;
}